

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> * __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_>::operator=
          (ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> *this,
          ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> *param_1)

{
  NullableValue<kj::Exception>::operator=
            ((NullableValue<kj::Exception> *)this,(NullableValue<kj::Exception> *)param_1);
  NullableValue<kj::Maybe<kj::Own<capnp::MessageReader>_>_>::operator=
            (&(this->value).ptr,&(param_1->value).ptr);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;